

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse41_128_64.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m128i *palVar3;
  __m128i *palVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  __m128i *b;
  uint uVar8;
  ulong uVar9;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  __m128i *palVar11;
  int32_t in_R9D;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  ulong extraout_XMM0_Qb_03;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i alVar12;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i c;
  __m128i vH_00;
  __m128i vH_01;
  int32_t in_stack_fffffffffffffc38;
  int32_t temp;
  int32_t column_len;
  int64_t *t;
  __m128i *pv_2;
  __m128i *pv_1;
  __m128i vCompare;
  __m128i *pv;
  __m128i *vP;
  __m128i vH;
  __m128i vF;
  __m128i vE;
  parasail_result_t *result;
  int64_t maxp;
  __m128i vMaxHUnit;
  __m128i vMaxH;
  int64_t local_310;
  int64_t score;
  __m128i vNegInf;
  __m128i vZero;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvE;
  __m128i *pvHMax;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  uint local_288;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  size_t len;
  longlong extraout_RDX_01;
  ulong uVar10;
  longlong extraout_RDX_02;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse41_128_64","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile64).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse41_128_64",
            "profile->profile64.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse41_128_64",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_striped_profile_sse41_128_64",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_striped_profile_sse41_128_64","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_striped_profile_sse41_128_64","s2Len")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_striped_profile_sse41_128_64","open")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_striped_profile_sse41_128_64","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    local_288 = 0;
    iVar7 = profile->s1Len;
    iVar5 = (iVar7 + 1) / 2;
    local_310 = -0x4000000000000000;
    iVar6 = profile->matrix->max;
    profile_local = (parasail_profile_t *)parasail_result_new_table1(iVar5 * 2,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x2800804;
      uVar8 = *(uint *)&profile_local->field_0xc | 0x20000;
      len = (size_t)uVar8;
      *(uint *)&profile_local->field_0xc = uVar8;
      pvHLoad = parasail_memalign___m128i(0x10,(long)iVar5);
      pvHMax = parasail_memalign___m128i(0x10,(long)iVar5);
      pvE = parasail_memalign___m128i(0x10,(long)iVar5);
      b = parasail_memalign___m128i(0x10,(long)iVar5);
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHMax == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar12[0] = (long)iVar5;
        alVar12[1] = extraout_RDX;
        parasail_memset___m128i(pvHLoad,alVar12,len);
        c[0] = (long)iVar5;
        c[1] = extraout_RDX_00;
        palVar11 = b;
        parasail_memset___m128i(b,c,len);
        for (end_query = 0; palVar4 = pvHLoad, palVar3 = pvE, end_query < s2Len;
            end_query = end_query + 1) {
          vH_01[0] = (ulong)end_query;
          uVar10 = (ulong)(byte)s2[vH_01[0]];
          uVar9 = (ulong)(end_query - 2U);
          if (local_288 == end_query - 2U) {
            pvE = pvHMax;
            pvHLoad = palVar3;
          }
          else {
            pvHLoad = pvHMax;
          }
          pvHMax = palVar4;
          for (k = 0; k < iVar5; k = k + 1) {
            b_00[1] = (long)k * 0x10;
            a[1] = vH_01[0];
            a[0] = (longlong)palVar11;
            b_00[0] = uVar10;
            alVar12 = _mm_max_epi64_rpl(a,b_00);
            b_01[0] = alVar12[1];
            a_00[1] = vH_01[0];
            a_00[0] = (longlong)palVar11;
            b_01[1] = b_00[1];
            alVar12 = _mm_max_epi64_rpl(a_00,b_01);
            b_02[0] = alVar12[1];
            a_01[1] = vH_01[0];
            a_01[0] = (longlong)palVar11;
            b_02[1] = b_00[1];
            _mm_max_epi64_rpl(a_01,b_02);
            pvHLoad[k][0] = extraout_XMM0_Qa;
            pvHLoad[k][1] = extraout_XMM0_Qb;
            palVar11 = (__m128i *)
                       ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                       rowcols->score_row;
            vH_00[0] = (ulong)(uint)k;
            vH_01[0] = (ulong)(uint)end_query;
            vH_00[1]._0_4_ = iVar5;
            vH_00[1]._4_4_ = 0;
            arr_store_si128((int *)palVar11,vH_00,end_query,s2Len,in_R9D,in_stack_fffffffffffffc38);
            a_02[1] = vH_00[0];
            a_02[0] = (longlong)palVar11;
            b_03[1] = vH_01[0];
            b_03[0] = extraout_RDX_01;
            alVar12 = _mm_max_epi64_rpl(a_02,b_03);
            b_04[0] = alVar12[1];
            a_03[1] = vH_00[0];
            a_03[0] = (longlong)palVar11;
            b_04[1] = vH_01[0];
            alVar12 = _mm_max_epi64_rpl(a_03,b_04);
            b_05[0] = alVar12[1];
            b_05[1] = (long)k * 0x10;
            b[k][0] = extraout_XMM0_Qa_00;
            b[k][1] = extraout_XMM0_Qb_00;
            a_04[1] = vH_00[0];
            a_04[0] = (longlong)palVar11;
            alVar12 = _mm_max_epi64_rpl(a_04,b_05);
            uVar10 = alVar12[1];
            uVar9 = (long)k * 0x10;
            vH_01[0] = vH_00[0];
          }
          for (end_ref = 0; end_ref < 2; end_ref = end_ref + 1) {
            for (k = 0; k < iVar5; k = k + 1) {
              b_06[1] = (long)k * 0x10;
              a_05[1] = vH_01[0];
              a_05[0] = (longlong)palVar11;
              b_06[0] = uVar10;
              _mm_max_epi64_rpl(a_05,b_06);
              pvHLoad[k][0] = extraout_XMM0_Qa_01;
              pvHLoad[k][1] = extraout_XMM0_Qb_01;
              palVar11 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_01[0] = (ulong)(uint)k;
              uVar9 = (ulong)(uint)end_query;
              vH_01[1]._0_4_ = iVar5;
              vH_01[1]._4_4_ = 0;
              arr_store_si128((int *)palVar11,vH_01,end_query,s2Len,in_R9D,in_stack_fffffffffffffc38
                             );
              a_06[1] = vH_01[0];
              a_06[0] = (longlong)palVar11;
              b_07[1] = uVar9;
              b_07[0] = extraout_RDX_02;
              alVar12 = _mm_max_epi64_rpl(a_06,b_07);
              b_08[0] = alVar12[1];
              a_07[1] = vH_01[0];
              a_07[0] = (longlong)palVar11;
              b_08[1] = uVar9;
              alVar12 = _mm_cmpgt_epi64_rpl(a_07,b_08);
              uVar10 = alVar12[1];
              auVar2._8_8_ = extraout_XMM0_Qb_02;
              auVar2._0_8_ = extraout_XMM0_Qa_02;
              if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar2 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar2 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar2 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar2 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar2 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar2 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar2 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (extraout_XMM0_Qb_02 >> 7 & 1) == 0) &&
                       (extraout_XMM0_Qb_02 >> 0xf & 1) == 0) &&
                      (extraout_XMM0_Qb_02 >> 0x17 & 1) == 0) &&
                     (extraout_XMM0_Qb_02 >> 0x1f & 1) == 0) &&
                    (extraout_XMM0_Qb_02 >> 0x27 & 1) == 0) &&
                   (extraout_XMM0_Qb_02 >> 0x2f & 1) == 0) && (extraout_XMM0_Qb_02 >> 0x37 & 1) == 0
                  ) && -1 < (long)extraout_XMM0_Qb_02) goto LAB_0099089f;
            }
          }
LAB_0099089f:
          a_08[1] = vH_01[0];
          a_08[0] = (longlong)palVar11;
          b_09[1] = uVar9;
          b_09[0] = uVar10;
          _mm_cmpgt_epi64_rpl(a_08,b_09);
          auVar1._8_8_ = extraout_XMM0_Qb_03;
          auVar1._0_8_ = extraout_XMM0_Qa_03;
          if ((((((((((((((((auVar1 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar1 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar1 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar1 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar1 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar1 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar1 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar1 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (extraout_XMM0_Qb_03 >> 7 & 1) != 0) || (extraout_XMM0_Qb_03 >> 0xf & 1) != 0)
                  || (extraout_XMM0_Qb_03 >> 0x17 & 1) != 0) ||
                 (extraout_XMM0_Qb_03 >> 0x1f & 1) != 0) || (extraout_XMM0_Qb_03 >> 0x27 & 1) != 0)
               || (extraout_XMM0_Qb_03 >> 0x2f & 1) != 0) || (extraout_XMM0_Qb_03 >> 0x37 & 1) != 0)
              || (long)extraout_XMM0_Qb_03 < 0) {
            a_09[1] = vH_01[0];
            a_09[0] = (longlong)palVar11;
            local_310 = _mm_hmax_epi64_rpl(a_09);
            if (0x7fffffffffffffff - (long)(iVar6 + 1) < local_310) {
              *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
              break;
            }
            local_288 = end_query;
          }
        }
        palVar11 = pvE;
        if (local_310 == 0x7fffffffffffffff) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
        }
        iVar6 = parasail_result_is_saturated((parasail_result_t *)profile_local);
        if (iVar6 == 0) {
          if (local_288 == end_query - 1U) {
            pvE = pvHLoad;
            pvHLoad = palVar11;
          }
          else if (local_288 == end_query - 2U) {
            pvE = pvHMax;
            pvHMax = palVar11;
          }
          _temp = *pvE;
          s1Len = iVar7 + -1;
          for (k = 0; k < iVar5 * 2; k = k + 1) {
            if ((*_temp == local_310) && (iVar7 = k / 2 + (k % 2) * iVar5, iVar7 < s1Len)) {
              s1Len = iVar7;
            }
            _temp = _temp + 1;
          }
        }
        else {
          local_310 = 0x7fffffffffffffff;
          s1Len = 0;
          local_288 = 0;
        }
        *(int *)&profile_local->s1 = (int)local_310;
        *(int32_t *)((long)&profile_local->s1 + 4) = s1Len;
        profile_local->s1Len = local_288;
        parasail_free(b);
        parasail_free(pvE);
        parasail_free(pvHMax);
        parasail_free(pvHLoad);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int64_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            vH = _mm_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}